

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase646::run(TestCase646 *this)

{
  PromiseFulfiller<void> **this_00;
  bool bVar1;
  uint uVar2;
  Promise<void> *promise_00;
  PromiseFulfiller<void> *pPVar3;
  int __timeout;
  char *in_RCX;
  nfds_t __nfds;
  Promise<void> PVar4;
  bool local_101;
  bool _kj_shouldLog_4;
  Fault f;
  undefined1 local_f0 [6];
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  Promise<void> promise;
  undefined1 local_d8 [6];
  bool _kj_shouldLog_1;
  undefined1 local_c8 [8];
  PromiseFulfillerPair<void> paf;
  undefined1 local_a0 [7];
  bool _kj_shouldLog;
  TaskSet tasks;
  ErrorHandlerImpl errorHandler;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase646 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  this_00 = &tasks.emptyFulfiller.ptr.ptr;
  ErrorHandlerImpl::ErrorHandlerImpl((ErrorHandlerImpl *)this_00);
  TaskSet::TaskSet((TaskSet *)local_a0,(ErrorHandler *)this_00);
  bVar1 = TaskSet::isEmpty((TaskSet *)local_a0);
  if (!bVar1) {
    paf.fulfiller.ptr._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)paf.fulfiller.ptr._7_1_ != false) {
      in_RCX = "\"failed: expected \" \"tasks.isEmpty()\"";
      _::Debug::log<char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x28c,ERROR,"\"failed: expected \" \"tasks.isEmpty()\"",
                 (char (*) [33])"failed: expected tasks.isEmpty()");
      paf.fulfiller.ptr._7_1_ = false;
    }
  }
  newPromiseAndFulfiller<void>();
  promise_00 = mv<kj::Promise<void>>((Promise<void> *)local_c8);
  TaskSet::add((TaskSet *)local_a0,promise_00);
  evalLater<kj::(anonymous_namespace)::TestCase646::run()::__0>
            ((kj *)local_d8,(Type *)((long)&promise.super_PromiseBase.node.ptr + 7));
  TaskSet::add((TaskSet *)local_a0,(Promise<void> *)local_d8);
  Promise<void>::~Promise((Promise<void> *)local_d8);
  bVar1 = TaskSet::isEmpty((TaskSet *)local_a0);
  if (bVar1) {
    promise.super_PromiseBase.node.ptr._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)promise.super_PromiseBase.node.ptr._6_1_ != false) {
      in_RCX = "\"failed: expected \" \"!tasks.isEmpty()\"";
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x292,ERROR,"\"failed: expected \" \"!tasks.isEmpty()\"",
                 (char (*) [34])"failed: expected !tasks.isEmpty()");
      promise.super_PromiseBase.node.ptr._6_1_ = false;
    }
  }
  PVar4 = TaskSet::onEmpty((TaskSet *)local_f0);
  uVar2 = Promise<void>::poll((Promise<void> *)local_f0,(pollfd *)local_58,
                              (nfds_t)PVar4.super_PromiseBase.node.ptr,(int)in_RCX);
  if ((uVar2 & 1) != 0) {
    f.exception._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)f.exception._7_1_ != false) {
      in_RCX = "\"failed: expected \" \"!promise.poll(waitScope)\"";
      _::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x295,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\"",
                 (char (*) [42])"failed: expected !promise.poll(waitScope)");
      f.exception._7_1_ = false;
    }
  }
  bVar1 = TaskSet::isEmpty((TaskSet *)local_a0);
  __timeout = (int)in_RCX;
  if (bVar1) {
    f.exception._6_1_ = _::Debug::shouldLog(ERROR);
    while (__timeout = (int)in_RCX, (bool)f.exception._6_1_ != false) {
      in_RCX = "\"failed: expected \" \"!tasks.isEmpty()\"";
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x296,ERROR,"\"failed: expected \" \"!tasks.isEmpty()\"",
                 (char (*) [34])"failed: expected !tasks.isEmpty()");
      f.exception._6_1_ = false;
    }
  }
  pPVar3 = Own<kj::PromiseFulfiller<void>_>::operator->
                     ((Own<kj::PromiseFulfiller<void>_> *)&paf.promise.super_PromiseBase.node.ptr);
  (**pPVar3->_vptr_PromiseFulfiller)(pPVar3,(undefined1 *)((long)&f.exception + 5));
  uVar2 = Promise<void>::poll((Promise<void> *)local_f0,(pollfd *)local_58,__nfds,__timeout);
  if ((uVar2 & 1) != 0) {
    bVar1 = TaskSet::isEmpty((TaskSet *)local_a0);
    if (!bVar1) {
      local_101 = _::Debug::shouldLog(ERROR);
      while (local_101 != false) {
        _::Debug::log<char_const(&)[33]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                   ,0x29a,ERROR,"\"failed: expected \" \"tasks.isEmpty()\"",
                   (char (*) [33])"failed: expected tasks.isEmpty()");
        local_101 = false;
      }
    }
    Promise<void>::wait((Promise<void> *)local_f0,local_58);
    Promise<void>::~Promise((Promise<void> *)local_f0);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_c8);
    TaskSet::~TaskSet((TaskSet *)local_a0);
    WaitScope::~WaitScope((WaitScope *)local_58);
    EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
    return;
  }
  _::Debug::Fault::Fault
            ((Fault *)&stack0xffffffffffffff00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
             ,0x299,FAILED,"promise.poll(waitScope)","");
  _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff00);
}

Assistant:

TEST(Async, TaskSetOnEmpty) {
  EventLoop loop;
  WaitScope waitScope(loop);
  ErrorHandlerImpl errorHandler;
  TaskSet tasks(errorHandler);

  KJ_EXPECT(tasks.isEmpty());

  auto paf = newPromiseAndFulfiller<void>();
  tasks.add(kj::mv(paf.promise));
  tasks.add(evalLater([]() {}));

  KJ_EXPECT(!tasks.isEmpty());

  auto promise = tasks.onEmpty();
  KJ_EXPECT(!promise.poll(waitScope));
  KJ_EXPECT(!tasks.isEmpty());

  paf.fulfiller->fulfill();
  KJ_ASSERT(promise.poll(waitScope));
  KJ_EXPECT(tasks.isEmpty());
  promise.wait(waitScope);
}